

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

float memory_tree_ns::train_node(memory_tree *b,single_learner *base,example *ec,uint32_t cn)

{
  float fVar1;
  float fVar2;
  label_t lVar3;
  node *pnVar4;
  uint in_ECX;
  example *in_RDX;
  size_t in_RSI;
  long in_RDI;
  uint uVar5;
  double dVar6;
  double dVar7;
  float save_binary_scalar;
  float ec_input_weight;
  float route_label;
  float weighted_value;
  float prediction;
  labels preds;
  labels multilabels;
  uint32_t save_multi_pred;
  label_t mc;
  example *ec_00;
  learner<char,_example> *in_stack_ffffffffffffff30;
  learner<char,_example> *this;
  float *local_68;
  float *local_60;
  float *local_58;
  size_t local_50;
  label_t local_48;
  wclass *local_40;
  wclass *local_38;
  size_t local_30;
  float local_28;
  label_t local_24;
  
  local_28 = 0.0;
  if (*(int *)(in_RDI + 0xcc) == 0) {
    local_24 = (in_RDX->l).multi;
    local_28 = (in_RDX->pred).scalar;
  }
  else {
    local_48 = (in_RDX->l).multi;
    local_40 = (in_RDX->l).cs.costs._end;
    local_38 = (in_RDX->l).cs.costs.end_array;
    local_30 = (in_RDX->l).cs.costs.erase_count;
    local_68 = (in_RDX->pred).scalars._begin;
    local_60 = (in_RDX->pred).scalars._end;
    local_58 = (in_RDX->pred).scalars.end_array;
    local_50 = (in_RDX->pred).scalars.erase_count;
  }
  (in_RDX->l).cs.costs._begin = (wclass *)0x3f8000003f800000;
  (in_RDX->l).simple.initial = 0.0;
  ec_00 = in_RDX;
  v_array<memory_tree_ns::node>::operator[]
            ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)in_ECX);
  LEARNER::learner<char,_example>::predict(in_stack_ffffffffffffff30,ec_00,in_RSI);
  fVar1 = (in_RDX->pred).scalar;
  fVar2 = *(float *)(in_RDI + 0x70);
  pnVar4 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)in_ECX);
  this = (learner<char,_example> *)pnVar4->nl;
  pnVar4 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)in_ECX);
  dVar6 = log((double)this / (pnVar4->nr + 0.1));
  dVar7 = log(2.0);
  uVar5 = -(uint)((float)(((1.0 - (double)fVar2) * dVar6) / dVar7 +
                         (double)(*(float *)(in_RDI + 0x70) * fVar1)) < 0.0);
  fVar1 = in_RDX->weight;
  in_RDX->weight = 1.0;
  lVar3.weight = 1.0;
  lVar3.label = ~uVar5 & 0x3f800000 | uVar5 & 0xbf800000;
  (in_RDX->l).multi = lVar3;
  (in_RDX->l).simple.initial = 0.0;
  v_array<memory_tree_ns::node>::operator[]
            ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)in_ECX);
  LEARNER::learner<char,_example>::learn(this,ec_00,in_RSI);
  v_array<memory_tree_ns::node>::operator[]
            ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)in_ECX);
  LEARNER::learner<char,_example>::predict(this,ec_00,in_RSI);
  fVar2 = (in_RDX->pred).scalar;
  if (*(int *)(in_RDI + 0xcc) == 0) {
    (in_RDX->l).multi = local_24;
    (in_RDX->pred).scalar = local_28;
  }
  else {
    (in_RDX->pred).scalars._begin = local_68;
    (in_RDX->pred).scalars._end = local_60;
    (in_RDX->pred).scalars.end_array = local_58;
    (in_RDX->pred).scalars.erase_count = local_50;
    (in_RDX->l).multi = local_48;
    (in_RDX->l).cs.costs._end = local_40;
    (in_RDX->l).cs.costs.end_array = local_38;
    (in_RDX->l).cs.costs.erase_count = local_30;
  }
  in_RDX->weight = fVar1;
  return fVar2;
}

Assistant:

float train_node(memory_tree& b, single_learner& base, example& ec, const uint32_t cn)
    {
        //predict, learn and predict
        //note: here we first train the router and then predict.
        MULTICLASS::label_t mc;
        uint32_t save_multi_pred = 0;
        MULTILABEL::labels multilabels;
        MULTILABEL::labels preds;
        if (b.oas == false){
            mc = ec.l.multi;
            save_multi_pred = ec.pred.multiclass;
        }
        else{
            multilabels = ec.l.multilabels;
            preds = ec.pred.multilabels;
        }

        ec.l.simple = {1.f, 1.f, 0.};
        base.predict(ec, b.nodes[cn].base_router);
        float prediction = ec.pred.scalar; 
	    //float imp_weight = 1.f; //no importance weight.
        
        float weighted_value = (1.-b.alpha)*log(b.nodes[cn].nl/(b.nodes[cn].nr+1e-1))/log(2.)+b.alpha*prediction;
        float route_label = weighted_value < 0.f ? -1.f : 1.f;
        
        //ec.l.simple = {route_label, imp_weight, 0.f}; 
        float ec_input_weight = ec.weight;
        ec.weight = 1.f;
	    ec.l.simple = {route_label, 1., 0.f};
        base.learn(ec, b.nodes[cn].base_router); //update the router according to the new example.
        
        base.predict(ec, b.nodes[cn].base_router);
        float save_binary_scalar = ec.pred.scalar;

        if(b.oas == false){
            ec.l.multi = mc;
            ec.pred.multiclass = save_multi_pred;
        }
        else{
            ec.pred.multilabels = preds;
            ec.l.multilabels = multilabels;
        }
        ec.weight = ec_input_weight;

        return save_binary_scalar;
    }